

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O2

void __thiscall spatial_region::scale_j(spatial_region *this,double scale)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  cellj ***pppcVar6;
  cellj *pcVar7;
  double dVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar3 = this->ny;
  uVar4 = this->nx;
  for (uVar9 = 0; uVar9 != (~((int)uVar4 >> 0x1f) & uVar4); uVar9 = uVar9 + 1) {
    uVar5 = this->nz;
    for (uVar10 = 0; uVar10 != (~((int)uVar3 >> 0x1f) & uVar3); uVar10 = uVar10 + 1) {
      pppcVar6 = (this->cj).p._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                 ._M_t.super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                 super__Head_base<0UL,_cellj_***,_false>._M_head_impl;
      for (lVar11 = 0; (ulong)(~((int)uVar5 >> 0x1f) & uVar5) * 0x18 - lVar11 != 0;
          lVar11 = lVar11 + 0x18) {
        pcVar7 = pppcVar6[uVar9][uVar10];
        pdVar1 = (double *)((long)&pcVar7->jx + lVar11);
        dVar8 = pdVar1[1];
        pdVar2 = (double *)((long)&pcVar7->jx + lVar11);
        *pdVar2 = scale * *pdVar1;
        pdVar2[1] = scale * dVar8;
        *(double *)((long)&pcVar7->jz + lVar11) = scale * *(double *)((long)&pcVar7->jz + lVar11);
      }
    }
  }
  return;
}

Assistant:

void spatial_region::scale_j(const double scale) {
    for (int i = 0; i < nx; i++) {
        for (int j = 0; j < ny; j++) {
            for (int k = 0; k < nz; k++) {
                cj[i][j][k].jx *= scale;
                cj[i][j][k].jy *= scale;
                cj[i][j][k].jz *= scale;
            }
        }
    }
}